

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::inputMethodEvent(QWidgetTextControlPrivate *this,QInputMethodEvent *e)

{
  const_iterator before;
  const_iterator before_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  QWidgetTextControl *pQVar9;
  QString *pQVar10;
  ulong uVar11;
  QList<QInputMethodEvent::Attribute> *pQVar12;
  qsizetype qVar13;
  const_reference pAVar14;
  QList_conflict2 *pQVar15;
  iterator iVar16;
  FormatRange *pFVar17;
  QTextCursorPrivate *pQVar18;
  QEvent *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  int rangeStart;
  int end;
  int start;
  Attribute *a_1;
  int i_1;
  int oldPreeditCursor;
  QTextLayout *layout;
  int blockStart;
  Attribute *a;
  int i;
  int oldCursorPos;
  bool isGettingInput;
  QWidgetTextControl *q;
  iterator it_1;
  iterator previous;
  iterator it;
  QList<QTextLayout::FormatRange> overrides;
  QTextCursor oldCursor;
  QTextCursor c;
  FormatRange o_2;
  FormatRange o_1;
  FormatRange range;
  FormatRange o;
  QTextCharFormat f;
  QTextBlock block;
  parameter_type in_stack_fffffffffffffd48;
  enum_type in_stack_fffffffffffffd50;
  enum_type in_stack_fffffffffffffd54;
  QFlagsStorage<Qt::TextInteractionFlag> in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  QWidgetTextControlPrivate *in_stack_fffffffffffffd80;
  QList_conflict2 *pQVar19;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 uVar20;
  byte local_22d;
  int local_21c;
  int local_1f8;
  int local_1d8;
  const_iterator local_1a8;
  FormatRange *local_1a0;
  FormatRange *local_198;
  iterator local_190;
  FormatRange *local_188;
  const_iterator local_180;
  iterator local_178;
  iterator local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  QChar local_13a [15];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_11c [5];
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined8 local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  QTextFormat local_88 [32];
  undefined1 *local_68;
  undefined1 *local_60;
  QTextBlock local_58 [2];
  QTextBlock local_38;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = q_func(in_RDI);
  Qt::operator|(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50);
  local_11c[0].super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)
                  CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                  (QFlags<Qt::TextInteractionFlag>)in_stack_fffffffffffffd58.i);
  bVar2 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)local_11c);
  local_22d = 1;
  if (!bVar2) {
    local_22d = QTextCursor::isNull();
  }
  if ((local_22d & 1) == 0) {
    QInputMethodEvent::commitString((QInputMethodEvent *)in_RSI);
    bVar3 = QString::isEmpty((QString *)0x717346);
    bVar4 = false;
    bVar2 = true;
    if (bVar3) {
      QInputMethodEvent::preeditString((QInputMethodEvent *)in_RSI);
      QTextCursor::block();
      QTextBlock::layout();
      QTextLayout::preeditAreaText();
      bVar4 = true;
      bVar3 = ::operator!=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                           (QString *)in_stack_fffffffffffffd48);
      bVar2 = true;
      if (!bVar3) {
        iVar5 = QInputMethodEvent::replacementLength((QInputMethodEvent *)in_RSI);
        bVar2 = 0 < iVar5;
      }
    }
    uVar20 = bVar2;
    if (bVar4) {
      QString::~QString((QString *)0x717407);
    }
    if (bVar2 == false) {
      QInputMethodEvent::attributes((QInputMethodEvent *)in_RSI);
      bVar4 = QList<QInputMethodEvent::Attribute>::isEmpty
                        ((QList<QInputMethodEvent::Attribute> *)0x717433);
      if (bVar4) {
        QEvent::ignore(in_RSI);
        goto LAB_007180c5;
      }
    }
    iVar5 = QTextCursor::position();
    QTextCursor::beginEditBlock();
    if (bVar2 != false) {
      QTextCursor::removeSelectedText();
    }
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::QTextBlock((QTextBlock *)local_28);
    QInputMethodEvent::commitString((QInputMethodEvent *)in_RSI);
    bVar4 = QString::isEmpty((QString *)0x7174cf);
    if ((!bVar4) ||
       (iVar6 = QInputMethodEvent::replacementLength((QInputMethodEvent *)in_RSI), iVar6 != 0)) {
      pQVar10 = QInputMethodEvent::commitString((QInputMethodEvent *)in_RSI);
      QChar::QChar<QChar::SpecialCharacter,_true>(local_13a,LineFeed);
      uVar11 = QString::endsWith((QChar *)pQVar10,(uint)(ushort)local_13a[0].ucs);
      if ((uVar11 & 1) != 0) {
        QTextCursor::block();
        QTextBlock::operator=((QTextBlock *)local_28,&local_38);
      }
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_148,&in_RDI->cursor);
      iVar6 = QTextCursor::position();
      iVar7 = QInputMethodEvent::replacementStart((QInputMethodEvent *)in_RSI);
      QTextCursor::setPosition((int)&local_148,iVar6 + iVar7);
      iVar6 = QTextCursor::position();
      iVar7 = QInputMethodEvent::replacementLength((QInputMethodEvent *)in_RSI);
      QTextCursor::setPosition((int)&local_148,iVar6 + iVar7);
      QInputMethodEvent::commitString((QInputMethodEvent *)in_RSI);
      QTextCursor::insertText((QString *)&local_148);
      QTextCursor::~QTextCursor((QTextCursor *)&local_148);
    }
    local_1d8 = 0;
    while( true ) {
      pQVar12 = QInputMethodEvent::attributes((QInputMethodEvent *)in_RSI);
      qVar13 = QList<QInputMethodEvent::Attribute>::size(pQVar12);
      if (qVar13 <= local_1d8) break;
      QInputMethodEvent::attributes((QInputMethodEvent *)in_RSI);
      pAVar14 = QList<QInputMethodEvent::Attribute>::at
                          ((QList<QInputMethodEvent::Attribute> *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                           (qsizetype)in_stack_fffffffffffffd48);
      if (*(int *)pAVar14 == 4) {
        local_150 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::QTextCursor((QTextCursor *)&local_150,&in_RDI->cursor);
        iVar6 = *(int *)(pAVar14 + 4);
        QTextCursor::block();
        iVar7 = QTextBlock::position();
        QTextCursor::setPosition((int)in_RDI + 0x88,iVar6 + iVar7);
        QTextCursor::setPosition((int)in_RDI + 0x88,iVar6 + iVar7 + *(int *)(pAVar14 + 8));
        (**(code **)(*(long *)pQVar9 + 0x60))();
        repaintOldAndNewSelection
                  (in_stack_fffffffffffffd80,
                   (QTextCursor *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        QTextCursor::~QTextCursor((QTextCursor *)&local_150);
      }
      local_1d8 = local_1d8 + 1;
    }
    uVar11 = QTextBlock::isValid();
    if ((uVar11 & 1) == 0) {
      QTextCursor::block();
      QTextBlock::operator=((QTextBlock *)local_28,local_58);
    }
    pQVar15 = (QList_conflict2 *)QTextBlock::layout();
    if (bVar2 != false) {
      pQVar19 = pQVar15;
      in_stack_fffffffffffffd7c = QTextCursor::position();
      iVar7 = (int)pQVar19;
      iVar6 = QTextBlock::position();
      uVar8 = in_stack_fffffffffffffd7c - iVar6;
      QInputMethodEvent::preeditString((QInputMethodEvent *)in_RSI);
      QTextLayout::setPreeditArea(iVar7,(QString *)(ulong)uVar8);
    }
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    local_160 = &DAT_aaaaaaaaaaaaaaaa;
    local_158 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x71787f);
    pQVar12 = QInputMethodEvent::attributes((QInputMethodEvent *)in_RSI);
    QList<QInputMethodEvent::Attribute>::size(pQVar12);
    QList<QTextLayout::FormatRange>::reserve
              ((QList<QTextLayout::FormatRange> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               CONCAT17(uVar20,in_stack_fffffffffffffdb8));
    iVar6 = in_RDI->preeditCursor;
    pQVar10 = QInputMethodEvent::preeditString((QInputMethodEvent *)in_RSI);
    qVar13 = QString::size(pQVar10);
    in_RDI->preeditCursor = (int)qVar13;
    in_RDI->hideCursor = false;
    local_1f8 = 0;
    while( true ) {
      pQVar12 = QInputMethodEvent::attributes((QInputMethodEvent *)in_RSI);
      qVar13 = QList<QInputMethodEvent::Attribute>::size(pQVar12);
      if (qVar13 <= local_1f8) break;
      QInputMethodEvent::attributes((QInputMethodEvent *)in_RSI);
      pAVar14 = QList<QInputMethodEvent::Attribute>::at
                          ((QList<QInputMethodEvent::Attribute> *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                           (qsizetype)in_stack_fffffffffffffd48);
      if (*(int *)pAVar14 == 1) {
        in_RDI->preeditCursor = *(int *)(pAVar14 + 4);
        in_RDI->hideCursor = (bool)((*(int *)(pAVar14 + 8) != 0 ^ 0xffU) & 1);
      }
      else if (*(int *)pAVar14 == 0) {
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::charFormat();
        qvariant_cast<QTextFormat>
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        QTextFormat::toCharFormat();
        QTextFormat::merge((QTextFormat *)&local_68);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x717a30);
        QTextFormat::~QTextFormat(local_88);
        bVar2 = QTextCharFormat::isValid((QTextCharFormat *)0x717a4a);
        if (bVar2) {
          local_a0 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          local_90 = &DAT_aaaaaaaaaaaaaaaa;
          QTextLayout::FormatRange::FormatRange((FormatRange *)0x717a8d);
          in_stack_fffffffffffffd68 = *(int *)(pAVar14 + 4);
          in_stack_fffffffffffffd6c = QTextCursor::position();
          in_stack_fffffffffffffd6c = in_stack_fffffffffffffd68 + in_stack_fffffffffffffd6c;
          iVar7 = QTextBlock::position();
          local_a0 = (undefined1 *)
                     CONCAT44(*(undefined4 *)(pAVar14 + 8),in_stack_fffffffffffffd6c - iVar7);
          QTextCharFormat::operator=
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     (QTextCharFormat *)in_stack_fffffffffffffd48);
          local_170.i = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
          local_170 = QList<QTextLayout::FormatRange>::end
                                ((QList<QTextLayout::FormatRange> *)
                                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
          while( true ) {
            iVar16 = QList<QTextLayout::FormatRange>::begin
                               ((QList<QTextLayout::FormatRange> *)
                                CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
            bVar2 = QList<QTextLayout::FormatRange>::iterator::operator!=(&local_170,iVar16);
            if (!bVar2) break;
            local_178.i = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
            local_178 = QList<QTextLayout::FormatRange>::iterator::operator-
                                  ((iterator *)
                                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                   (qsizetype)in_stack_fffffffffffffd48);
            iVar7 = (int)local_a0;
            pFVar17 = QList<QTextLayout::FormatRange>::iterator::operator->(&local_178);
            if (pFVar17->start <= iVar7) {
              local_188 = local_170.i;
              QList<QTextLayout::FormatRange>::const_iterator::const_iterator(&local_180,local_170);
              before.i._4_4_ = in_stack_fffffffffffffd6c;
              before.i._0_4_ = in_stack_fffffffffffffd68;
              QList<QTextLayout::FormatRange>::insert
                        ((QList<QTextLayout::FormatRange> *)
                         CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),before,
                         in_stack_fffffffffffffd48);
              break;
            }
            local_170.i = local_178.i;
          }
          iVar16 = QList<QTextLayout::FormatRange>::begin
                             ((QList<QTextLayout::FormatRange> *)
                              CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
          bVar2 = QList<QTextLayout::FormatRange>::iterator::operator==(&local_170,iVar16);
          if (bVar2) {
            QList<QTextLayout::FormatRange>::prepend
                      ((QList<QTextLayout::FormatRange> *)
                       CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                       in_stack_fffffffffffffd48);
          }
          QTextLayout::FormatRange::~FormatRange((FormatRange *)0x717c56);
        }
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x717c63);
      }
      local_1f8 = local_1f8 + 1;
    }
    QTextCursor::charFormat();
    bVar2 = QTextCharFormat::isValid((QTextCharFormat *)0x717ca3);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x717cb4);
    if (bVar2) {
      in_stack_fffffffffffffd54 = QTextCursor::position();
      local_21c = QTextBlock::position();
      local_21c = in_stack_fffffffffffffd54 - local_21c;
      iVar7 = local_21c;
      pQVar10 = QInputMethodEvent::preeditString((QInputMethodEvent *)in_RSI);
      qVar13 = QString::size(pQVar10);
      iVar7 = iVar7 + (int)qVar13;
      local_190.i = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_190 = QList<QTextLayout::FormatRange>::begin
                            ((QList<QTextLayout::FormatRange> *)
                             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      while( true ) {
        iVar16 = QList<QTextLayout::FormatRange>::end
                           ((QList<QTextLayout::FormatRange> *)
                            CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        bVar2 = QList<QTextLayout::FormatRange>::iterator::operator!=(&local_190,iVar16);
        if (!bVar2) break;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QTextLayout::FormatRange>::iterator::operator*(&local_190);
        QTextLayout::FormatRange::FormatRange
                  ((FormatRange *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48);
        iVar1 = (int)local_c8;
        if (local_21c < (int)local_c8) {
          local_e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          local_d0 = &DAT_aaaaaaaaaaaaaaaa;
          QTextLayout::FormatRange::FormatRange((FormatRange *)0x717e23);
          local_e0 = (undefined1 *)CONCAT44(iVar1 - local_21c,local_21c);
          QTextCursor::charFormat();
          QTextCharFormat::operator=
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     (QTextCharFormat *)in_stack_fffffffffffffd48);
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x717e85);
          QList<QTextLayout::FormatRange>::const_iterator::const_iterator(&local_1a8,local_190);
          before_00.i._4_4_ = in_stack_fffffffffffffd6c;
          before_00.i._0_4_ = in_stack_fffffffffffffd68;
          local_1a0 = (FormatRange *)
                      QList<QTextLayout::FormatRange>::insert
                                ((QList<QTextLayout::FormatRange> *)
                                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                 before_00,in_stack_fffffffffffffd48);
          local_198 = (FormatRange *)
                      QList<QTextLayout::FormatRange>::iterator::operator+
                                ((iterator *)
                                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                 (qsizetype)in_stack_fffffffffffffd48);
          local_190 = (iterator)local_198;
          QTextLayout::FormatRange::~FormatRange((FormatRange *)0x717f06);
        }
        QList<QTextLayout::FormatRange>::iterator::operator++(&local_190);
        local_21c = (int)local_c8 + local_c8._4_4_;
        QTextLayout::FormatRange::~FormatRange((FormatRange *)0x717f35);
      }
      if (local_21c < iVar7) {
        local_108 = &DAT_aaaaaaaaaaaaaaaa;
        local_100 = &DAT_aaaaaaaaaaaaaaaa;
        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
        QTextLayout::FormatRange::FormatRange((FormatRange *)0x717f88);
        local_108 = (undefined1 *)CONCAT44(iVar7 - local_21c,local_21c);
        QTextCursor::charFormat();
        QTextCharFormat::operator=
                  ((QTextCharFormat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (QTextCharFormat *)in_stack_fffffffffffffd48);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x717fea);
        QList<QTextLayout::FormatRange>::append
                  ((QList<QTextLayout::FormatRange> *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48);
        QTextLayout::FormatRange::~FormatRange((FormatRange *)0x71800c);
      }
    }
    QTextLayout::setFormats(pQVar15);
    QTextCursor::endEditBlock();
    pQVar18 = ::QSharedDataPointer::operator_cast_to_QTextCursorPrivate_
                        ((QSharedDataPointer<QTextCursorPrivate> *)
                         CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    if (pQVar18 != (QTextCursorPrivate *)0x0) {
      QSharedDataPointer<QTextCursorPrivate>::operator->
                ((QSharedDataPointer<QTextCursorPrivate> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      QTextCursorPrivate::setX();
    }
    iVar7 = QTextCursor::position();
    if (iVar5 != iVar7) {
      QWidgetTextControl::cursorPositionChanged((QWidgetTextControl *)0x718097);
    }
    if (iVar6 != in_RDI->preeditCursor) {
      QWidgetTextControl::microFocusChanged((QWidgetTextControl *)0x7180b8);
    }
    QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x7180c5);
  }
  else {
    QEvent::ignore(in_RSI);
  }
LAB_007180c5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::inputMethodEvent(QInputMethodEvent *e)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & (Qt::TextEditable | Qt::TextSelectableByMouse)) || cursor.isNull()) {
        e->ignore();
        return;
    }
    bool isGettingInput = !e->commitString().isEmpty()
            || e->preeditString() != cursor.block().layout()->preeditAreaText()
            || e->replacementLength() > 0;

    if (!isGettingInput && e->attributes().isEmpty()) {
        e->ignore();
        return;
    }

    int oldCursorPos = cursor.position();

    cursor.beginEditBlock();
    if (isGettingInput) {
        cursor.removeSelectedText();
    }

    QTextBlock block;

    // insert commit string
    if (!e->commitString().isEmpty() || e->replacementLength()) {
        if (e->commitString().endsWith(QChar::LineFeed))
            block = cursor.block(); // Remember the block where the preedit text is
        QTextCursor c = cursor;
        c.setPosition(c.position() + e->replacementStart());
        c.setPosition(c.position() + e->replacementLength(), QTextCursor::KeepAnchor);
        c.insertText(e->commitString());
    }

    for (int i = 0; i < e->attributes().size(); ++i) {
        const QInputMethodEvent::Attribute &a = e->attributes().at(i);
        if (a.type == QInputMethodEvent::Selection) {
            QTextCursor oldCursor = cursor;
            int blockStart = a.start + cursor.block().position();
            cursor.setPosition(blockStart, QTextCursor::MoveAnchor);
            cursor.setPosition(blockStart + a.length, QTextCursor::KeepAnchor);
            q->ensureCursorVisible();
            repaintOldAndNewSelection(oldCursor);
        }
    }

    if (!block.isValid())
        block = cursor.block();
    QTextLayout *layout = block.layout();
    if (isGettingInput)
        layout->setPreeditArea(cursor.position() - block.position(), e->preeditString());
    QList<QTextLayout::FormatRange> overrides;
    overrides.reserve(e->attributes().size());
    const int oldPreeditCursor = preeditCursor;
    preeditCursor = e->preeditString().size();
    hideCursor = false;
    for (int i = 0; i < e->attributes().size(); ++i) {
        const QInputMethodEvent::Attribute &a = e->attributes().at(i);
        if (a.type == QInputMethodEvent::Cursor) {
            preeditCursor = a.start;
            hideCursor = !a.length;
        } else if (a.type == QInputMethodEvent::TextFormat) {
            QTextCharFormat f = cursor.charFormat();
            f.merge(qvariant_cast<QTextFormat>(a.value).toCharFormat());
            if (f.isValid()) {
                QTextLayout::FormatRange o;
                o.start = a.start + cursor.position() - block.position();
                o.length = a.length;
                o.format = f;

                // Make sure list is sorted by start index
                QList<QTextLayout::FormatRange>::iterator it = overrides.end();
                while (it != overrides.begin()) {
                    QList<QTextLayout::FormatRange>::iterator previous = it - 1;
                    if (o.start >= previous->start) {
                        overrides.insert(it, o);
                        break;
                    }
                    it = previous;
                }

                if (it == overrides.begin())
                    overrides.prepend(o);
            }
        }
    }

    if (cursor.charFormat().isValid()) {
        int start = cursor.position() - block.position();
        int end = start + e->preeditString().size();

        QList<QTextLayout::FormatRange>::iterator it = overrides.begin();
        while (it != overrides.end()) {
            QTextLayout::FormatRange range = *it;
            int rangeStart = range.start;
            if (rangeStart > start) {
                QTextLayout::FormatRange o;
                o.start = start;
                o.length = rangeStart - start;
                o.format = cursor.charFormat();
                it = overrides.insert(it, o) + 1;
            }

            ++it;
            start = range.start + range.length;
        }

        if (start < end) {
            QTextLayout::FormatRange o;
            o.start = start;
            o.length = end - start;
            o.format = cursor.charFormat();
            overrides.append(o);
        }
    }
    layout->setFormats(overrides);

    cursor.endEditBlock();

    if (cursor.d)
        cursor.d->setX();
    if (oldCursorPos != cursor.position())
        emit q->cursorPositionChanged();
    if (oldPreeditCursor != preeditCursor)
        emit q->microFocusChanged();
}